

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_add(EditLine *el,wint_t c)

{
  el_action_t local_18;
  wchar_t ret;
  wint_t c_local;
  EditLine *el_local;
  
  (el->el_map).current = (el->el_map).key;
  if ((el->el_line).cursor < (el->el_line).lastchar) {
    (el->el_line).cursor = (el->el_line).cursor + 1;
    if ((el->el_line).lastchar < (el->el_line).cursor) {
      (el->el_line).cursor = (el->el_line).lastchar;
    }
    local_18 = '\x05';
  }
  else {
    local_18 = '\0';
  }
  cv_undo(el);
  return local_18;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_add(EditLine *el, wint_t c __attribute__((__unused__)))
{
	int ret;

	el->el_map.current = el->el_map.key;
	if (el->el_line.cursor < el->el_line.lastchar) {
		el->el_line.cursor++;
		if (el->el_line.cursor > el->el_line.lastchar)
			el->el_line.cursor = el->el_line.lastchar;
		ret = CC_CURSOR;
	} else
		ret = CC_NORM;

	cv_undo(el);

	return (el_action_t)ret;
}